

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O0

int out_value_anim_proc(Am_Object *self)

{
  bool bVar1;
  uint uVar2;
  uint val_00;
  Am_Value *pAVar3;
  int val;
  int old_val;
  Am_Object *self_local;
  
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)self,0x169);
  uVar2 = Am_Value::operator_cast_to_int(pAVar3);
  val_00 = get_value_end_of(self,INPUT_1);
  if (uVar2 != val_00) {
    pAVar3 = (Am_Value *)Am_Object::Get(0x74d8,0x169);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
    if (bVar1) {
      set_up_anim(self,val_00);
    }
    else {
      Am_Object::Set((ushort)self,0x169,(ulong)val_00);
    }
  }
  return val_00;
}

Assistant:

Am_Define_Formula(int, out_value_anim) {
  int old_val = self.Get(Am_VALUE); //no dependency
  int val = get_value_end_of(self, INPUT_1);
  if (old_val != val) {
    if ((bool) animations_command.Get(Am_VALUE)) //no dependency
      set_up_anim(self, val);
    else self.Set(Am_VALUE, val);  //not animating, use as out value now
  }
  return val;
}